

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O2

int ffppxn(fitsfile *fptr,int datatype,long *firstpix,LONGLONG nelem,void *array,void *nulval,
          int *status)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int naxis;
  LONGLONG naxes [9];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    if (nulval == (void *)0x0) {
      ffppx(fptr,datatype,firstpix,nelem,array,status);
    }
    else {
      ffgidm(fptr,&naxis,status);
      ffgiszll(fptr,9,naxes,status);
      uVar3 = 0;
      uVar2 = (ulong)(uint)naxis;
      if (naxis < 1) {
        uVar2 = uVar3;
      }
      lVar5 = 1;
      lVar4 = 0;
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        lVar4 = lVar4 + (firstpix[uVar3] + -1) * lVar5;
        lVar5 = lVar5 * naxes[uVar3];
      }
      lVar4 = lVar4 + 1;
      if (datatype == 0x52) {
        ffppnd(fptr,1,lVar4,nelem,(double *)array,*nulval,status);
      }
      else if (datatype == 0xc) {
        ffppnsb(fptr,1,lVar4,nelem,(char *)array,*nulval,status);
      }
      else if (datatype == 0x14) {
        ffppnui(fptr,1,lVar4,nelem,(unsigned_short *)array,*nulval,status);
      }
      else if (datatype == 0x15) {
        ffppni(fptr,1,lVar4,nelem,(short *)array,*nulval,status);
      }
      else if (datatype == 0x1e) {
        ffppnuk(fptr,1,lVar4,nelem,(uint *)array,*nulval,status);
      }
      else if (datatype == 0x1f) {
        ffppnk(fptr,1,lVar4,nelem,(int *)array,*nulval,status);
      }
      else if (datatype == 0x28) {
        ffppnuj(fptr,1,lVar4,nelem,(unsigned_long *)array,*nulval,status);
      }
      else if (datatype == 0x29) {
        ffppnj(fptr,1,lVar4,nelem,(long *)array,*nulval,status);
      }
      else if (datatype == 0x2a) {
        ffppne(fptr,1,lVar4,nelem,(float *)array,*nulval,status);
      }
      else if (datatype == 0x50) {
        ffppnujj(fptr,1,lVar4,nelem,(ULONGLONG *)array,*nulval,status);
      }
      else if (datatype == 0x51) {
        ffppnjj(fptr,1,lVar4,nelem,(LONGLONG *)array,*nulval,status);
      }
      else if (datatype == 0xb) {
        ffppnb(fptr,1,lVar4,nelem,(uchar *)array,*nulval,status);
      }
      else {
        *status = 0x19a;
      }
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffppxn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            long  *firstpix, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

  This routine supports writing to large images with
  more than 2**31 pixels.
*/
{
    int naxis, ii;
    long group = 1;
    LONGLONG firstelem, dimsize = 1, naxes[9];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffppx(fptr, datatype, firstpix, nelem, array, status);
        return(*status);
    }

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (datatype == TBYTE)
    {
      ffppnb(fptr, group, firstelem, nelem, (unsigned char *) array, 
             *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffppnsb(fptr, group, firstelem, nelem, (signed char *) array, 
             *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
      ffppnui(fptr, group, firstelem, nelem, (unsigned short *) array,
              *(unsigned short *) nulval,status);
    }
    else if (datatype == TSHORT)
    {
      ffppni(fptr, group, firstelem, nelem, (short *) array,
             *(short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffppnuk(fptr, group, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffppnk(fptr, group, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffppnuj(fptr, group, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval,status);
    }
    else if (datatype == TLONG)
    {
      ffppnj(fptr, group, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffppnujj(fptr, group, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffppnjj(fptr, group, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppne(fptr, group, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffppnd(fptr, group, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}